

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_parse_info.cpp
# Opt level: O1

unique_ptr<duckdb::AlterTableInfo,_std::default_delete<duckdb::AlterTableInfo>,_true> __thiscall
duckdb::AddColumnInfo::Deserialize(AddColumnInfo *this,Deserializer *deserializer)

{
  _Head_base<0UL,_duckdb::AddColumnInfo_*,_false> _Var1;
  _Head_base<0UL,_duckdb::AlterTableInfo_*,_false> _Var2;
  undefined1 uVar3;
  uint uVar4;
  pointer pAVar6;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *this_00;
  unique_ptr<duckdb::AddColumnInfo,_std::default_delete<duckdb::AddColumnInfo>,_true> result;
  ColumnDefinition new_column;
  _Head_base<0UL,_duckdb::AddColumnInfo_*,_false> local_1f0;
  _Head_base<0UL,_duckdb::AlterTableInfo_*,_false> local_1e8;
  undefined1 local_1e0 [216];
  undefined1 local_108 [216];
  int iVar5;
  
  (*deserializer->_vptr_Deserializer[2])(deserializer,400,"new_column");
  (*deserializer->_vptr_Deserializer[6])(deserializer);
  ColumnDefinition::Deserialize((ColumnDefinition *)local_1e0,deserializer);
  (*deserializer->_vptr_Deserializer[7])(deserializer);
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  local_1f0._M_head_impl = (AddColumnInfo *)operator_new(0x158);
  local_108._0_8_ = local_108 + 0x10;
  if ((undefined1 *)local_1e0._0_8_ == local_1e0 + 0x10) {
    local_108._24_8_ = local_1e0._24_8_;
  }
  else {
    local_108._0_8_ = local_1e0._0_8_;
  }
  local_108._8_8_ = local_1e0._8_8_;
  local_1e0._8_8_ = 0;
  local_1e0[0x10] = '\0';
  local_1e8._M_head_impl = &this->super_AlterTableInfo;
  local_1e0._0_8_ = local_1e0 + 0x10;
  LogicalType::LogicalType((LogicalType *)(local_108 + 0x20),(LogicalType *)(local_1e0 + 0x20));
  local_108._73_8_ = local_1e0._73_8_;
  local_108._56_8_ = local_1e0._56_8_;
  local_108._88_8_ = local_1e0._88_8_;
  local_1e0._88_8_ =
       (tuple<duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>)0x0;
  Value::Value((Value *)(local_108 + 0x60),(Value *)(local_1e0 + 0x60));
  this_00 = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             *)(local_1e0 + 0xa0);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                *)(local_108 + 0xa0),this_00,this_00);
  AddColumnInfo(local_1f0._M_head_impl,(ColumnDefinition *)local_108);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)(local_108 + 0xa0));
  Value::~Value((Value *)(local_108 + 0x60));
  if ((ParsedExpression *)local_108._88_8_ != (ParsedExpression *)0x0) {
    (*((BaseExpression *)local_108._88_8_)->_vptr_BaseExpression[1])();
  }
  local_108._88_8_ =
       (__uniq_ptr_data<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true,_true>
        )0x0;
  LogicalType::~LogicalType((LogicalType *)(local_108 + 0x20));
  if ((undefined1 *)local_108._0_8_ != local_108 + 0x10) {
    operator_delete((void *)local_108._0_8_);
  }
  pAVar6 = unique_ptr<duckdb::AddColumnInfo,_std::default_delete<duckdb::AddColumnInfo>,_true>::
           operator->((unique_ptr<duckdb::AddColumnInfo,_std::default_delete<duckdb::AddColumnInfo>,_true>
                       *)&local_1f0);
  uVar4 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x191,"if_column_not_exists");
  if ((char)uVar4 == '\0') {
    uVar3 = false;
  }
  else {
    iVar5 = (*deserializer->_vptr_Deserializer[0xc])(deserializer);
    uVar3 = (undefined1)iVar5;
  }
  pAVar6->if_column_not_exists = (bool)uVar3;
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar4 & 0xff));
  _Var2._M_head_impl = local_1e8._M_head_impl;
  _Var1._M_head_impl = local_1f0._M_head_impl;
  local_1f0._M_head_impl = (AddColumnInfo *)0x0;
  ((local_1e8._M_head_impl)->super_AlterInfo).super_ParseInfo._vptr_ParseInfo =
       (_func_int **)_Var1._M_head_impl;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(this_00);
  Value::~Value((Value *)(local_1e0 + 0x60));
  if ((tuple<duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>)
      local_1e0._88_8_ != (_Head_base<0UL,_duckdb::ParsedExpression_*,_false>)0x0) {
    (**(code **)(*(long *)local_1e0._88_8_ + 8))();
  }
  local_1e0._88_8_ = (_Head_base<0UL,_duckdb::ParsedExpression_*,_false>)0x0;
  LogicalType::~LogicalType((LogicalType *)(local_1e0 + 0x20));
  if ((undefined1 *)local_1e0._0_8_ != local_1e0 + 0x10) {
    operator_delete((void *)local_1e0._0_8_);
  }
  return (unique_ptr<duckdb::AlterTableInfo,_std::default_delete<duckdb::AlterTableInfo>_>)
         (__uniq_ptr_impl<duckdb::AlterTableInfo,_std::default_delete<duckdb::AlterTableInfo>_>)
         _Var2._M_head_impl;
}

Assistant:

unique_ptr<AlterTableInfo> AddColumnInfo::Deserialize(Deserializer &deserializer) {
	auto new_column = deserializer.ReadProperty<ColumnDefinition>(400, "new_column");
	auto result = duckdb::unique_ptr<AddColumnInfo>(new AddColumnInfo(std::move(new_column)));
	deserializer.ReadPropertyWithDefault<bool>(401, "if_column_not_exists", result->if_column_not_exists);
	return std::move(result);
}